

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_entity_sets.cc
# Opt level: O0

CodimMeshDataSet<unsigned_int> *
lf::mesh::utils::CountNumSuperEntities
          (CodimMeshDataSet<unsigned_int> *__return_storage_ptr__,
          shared_ptr<const_lf::mesh::Mesh> *mesh_p,dim_t codim_sub,dim_t codim_super)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  element_type *peVar4;
  ostream *this;
  runtime_error *prVar5;
  undefined4 extraout_var;
  reference ppEVar6;
  undefined4 extraout_var_00;
  uint *puVar7;
  Entity *subent;
  iterator __end3;
  iterator __begin3;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range3;
  Entity *e;
  iterator __end2;
  iterator __begin2;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range2;
  undefined1 local_438 [4];
  dim_t super_codim;
  undefined1 local_421;
  string local_420;
  allocator<char> local_3f9;
  string local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  stringstream local_3b0 [8];
  stringstream ss_1;
  ostream local_3a0 [376];
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  dim_t local_20;
  dim_t local_1c;
  dim_t codim_super_local;
  dim_t codim_sub_local;
  shared_ptr<const_lf::mesh::Mesh> *mesh_p_local;
  CodimMeshDataSet<unsigned_int> *sup_ent_cnt;
  
  local_20 = codim_super;
  local_1c = codim_sub;
  _codim_super_local =
       (__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)mesh_p
  ;
  mesh_p_local = (shared_ptr<const_lf::mesh::Mesh> *)__return_storage_ptr__;
  peVar4 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)mesh_p);
  uVar2 = (**peVar4->_vptr_Mesh)();
  if (uVar2 < local_1c) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    this = std::operator<<(local_198,"Illegal codim_sub = ");
    std::ostream::operator<<(this,local_1c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"(mesh_p->DimMesh() >= codim_sub)",&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/special_entity_sets.cc"
               ,&local_201);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d8,&local_200,0x16,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"this code should not be reached");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_20 <= local_1c) {
    local_421 = 0;
    std::shared_ptr<const_lf::mesh::Mesh>::shared_ptr
              ((shared_ptr<const_lf::mesh::Mesh> *)local_438,
               (shared_ptr<const_lf::mesh::Mesh> *)_codim_super_local);
    CodimMeshDataSet<unsigned_int>::CodimMeshDataSet
              (__return_storage_ptr__,(shared_ptr<const_lf::mesh::Mesh> *)local_438,local_1c,0);
    std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr
              ((shared_ptr<const_lf::mesh::Mesh> *)local_438);
    uVar2 = local_1c - local_20;
    peVar4 = std::
             __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(_codim_super_local);
    iVar3 = (*peVar4->_vptr_Mesh[2])(peVar4,(ulong)uVar2);
    __begin2._M_current = (Entity **)CONCAT44(extraout_var,iVar3);
    __end2 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                       ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2);
    e = (Entity *)
        std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                  ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2);
    while (bVar1 = __gnu_cxx::
                   operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                             (&__end2,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                       *)&e), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppEVar6 = __gnu_cxx::
                __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                ::operator*(&__end2);
      iVar3 = (*(*ppEVar6)->_vptr_Entity[1])(*ppEVar6,(ulong)local_20);
      __begin3._M_current = (Entity **)CONCAT44(extraout_var_00,iVar3);
      __end3 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                         ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3);
      subent = (Entity *)
               std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                         ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3);
      while (bVar1 = __gnu_cxx::
                     operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                               (&__end3,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                         *)&subent), ((bVar1 ^ 0xffU) & 1) != 0) {
        ppEVar6 = __gnu_cxx::
                  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                  ::operator*(&__end3);
        puVar7 = CodimMeshDataSet<unsigned_int>::operator()(__return_storage_ptr__,*ppEVar6);
        *puVar7 = *puVar7 + 1;
        __gnu_cxx::
        __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
        ::operator++(&__end3);
      }
      __gnu_cxx::
      __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
      ::operator++(&__end2);
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream(local_3b0);
  std::operator<<(local_3a0,"Codim_super to large");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,"codim_super <= codim_sub",&local_3d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/special_entity_sets.cc"
             ,&local_3f9);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_3d0,&local_3f8,0x17,&local_420);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator(&local_3f9);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar5,"this code should not be reached");
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

CodimMeshDataSet<lf::base::size_type> CountNumSuperEntities(
    const std::shared_ptr<const Mesh>& mesh_p, lf::base::dim_t codim_sub,
    lf::base::dim_t codim_super) {
  LF_VERIFY_MSG((mesh_p->DimMesh() >= codim_sub),
                "Illegal codim_sub = " << codim_sub);
  LF_VERIFY_MSG(codim_super <= codim_sub, "Codim_super to large");

  // Declare and initialize the data set
  CodimMeshDataSet<lf::base::size_type> sup_ent_cnt{mesh_p, codim_sub, 0};

  const lf::base::dim_t super_codim = codim_sub - codim_super;
  // Run through all super entities
  for (const lf::mesh::Entity* e : mesh_p->Entities(super_codim)) {
    // Traverse all sub-entities of a specific relative co-dimension
    for (const lf::mesh::Entity* subent : e->SubEntities(codim_super)) {
      // Write access to an entry in the data set
      sup_ent_cnt(*subent) += 1;
    }
  }
  return sup_ent_cnt;
}